

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_vector.c
# Opt level: O0

void vector_erase(vector v,size_t position)

{
  int iVar1;
  void *__dest;
  void *__src;
  ulong in_RSI;
  vector in_RDI;
  
  if ((in_RDI != (vector)0x0) && (in_RSI < in_RDI->size)) {
    if (in_RSI < in_RDI->size - 1) {
      __dest = vector_data_offset_bytes(in_RDI,in_RSI * in_RDI->type_size);
      __src = vector_data_offset_bytes(in_RDI,(in_RSI + 1) * in_RDI->type_size);
      memmove(__dest,__src,((in_RDI->size - in_RSI) + -1) * in_RDI->type_size);
    }
    in_RDI->size = in_RDI->size - 1;
    if ((in_RDI->capacity >> 3 < in_RDI->size) &&
       (iVar1 = vector_reserve(in_RDI,in_RSI), iVar1 != 0)) {
      log_write_impl_va("metacall",0x1cb,"vector_erase",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_vector.c"
                        ,LOG_LEVEL_ERROR,"Vector reserve error");
    }
  }
  return;
}

Assistant:

void vector_erase(vector v, size_t position)
{
	if (v != NULL && position < v->size)
	{
		if (position < v->size - 1)
		{
			memmove(vector_data_offset_bytes(v, position * v->type_size),
				vector_data_offset_bytes(v, (position + 1) * v->type_size),
				(v->size - position - 1) * v->type_size);
		}

		--v->size;

		if (v->capacity / VECTOR_CAPACITY_MIN_USED < v->size)
		{
			if (vector_reserve(v, v->size * VECTOR_CAPACITY_INCREMENT) != 0)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Vector reserve error");
			}
		}
	}
}